

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O0

bool __thiscall cmValue::IsOn(cmValue *this,string_view value)

{
  size_type sVar1;
  const_reference pvVar2;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  undefined1 local_20 [8];
  string_view value_local;
  
  value_local._M_len = value._M_len;
  local_20 = (undefined1  [8])this;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  switch(sVar1) {
  case 1:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    local_29 = true;
    if (*pvVar2 != '1') {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_29 = true;
      if (*pvVar2 != 'Y') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
        local_29 = *pvVar2 == 'y';
      }
    }
    value_local._M_str._7_1_ = local_29;
    break;
  case 2:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'O') {
LAB_0013de07:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      local_2b = true;
      if (*pvVar2 != 'N') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_2b = *pvVar2 == 'n';
      }
      local_2a = local_2b;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_2a = false;
      if (*pvVar2 == 'o') goto LAB_0013de07;
    }
    value_local._M_str._7_1_ = local_2a;
    break;
  case 3:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'Y') {
LAB_0013de7e:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      if (*pvVar2 != 'E') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_2c = false;
        if (*pvVar2 != 'e') goto LAB_0013deea;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
      local_2d = true;
      if (*pvVar2 != 'S') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
        local_2d = *pvVar2 == 's';
      }
      local_2c = local_2d;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_2c = false;
      if (*pvVar2 == 'y') goto LAB_0013de7e;
    }
LAB_0013deea:
    value_local._M_str._7_1_ = local_2c;
    break;
  case 4:
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    if (*pvVar2 == 'T') {
LAB_0013df2a:
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
      if (*pvVar2 != 'R') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,1);
        local_2e = false;
        if (*pvVar2 != 'r') goto LAB_0013dfc7;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
      if (*pvVar2 != 'U') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,2);
        local_2e = false;
        if (*pvVar2 != 'u') goto LAB_0013dfc7;
      }
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
      local_2f = true;
      if (*pvVar2 != 'E') {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_20,3);
        local_2f = *pvVar2 == 'e';
      }
      local_2e = local_2f;
    }
    else {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_2e = false;
      if (*pvVar2 == 't') goto LAB_0013df2a;
    }
LAB_0013dfc7:
    value_local._M_str._7_1_ = local_2e;
    break;
  default:
    value_local._M_str._7_1_ = false;
  }
  return value_local._M_str._7_1_;
}

Assistant:

bool cmValue::IsOn(cm::string_view value) noexcept
{
  switch (value.size()) {
    case 1:
      return value[0] == '1' || value[0] == 'Y' || value[0] == 'y';
    case 2:
      return                                    //
        (value[0] == 'O' || value[0] == 'o') && //
        (value[1] == 'N' || value[1] == 'n');
    case 3:
      return                                    //
        (value[0] == 'Y' || value[0] == 'y') && //
        (value[1] == 'E' || value[1] == 'e') && //
        (value[2] == 'S' || value[2] == 's');
    case 4:
      return                                    //
        (value[0] == 'T' || value[0] == 't') && //
        (value[1] == 'R' || value[1] == 'r') && //
        (value[2] == 'U' || value[2] == 'u') && //
        (value[3] == 'E' || value[3] == 'e');
    default:
      break;
  }

  return false;
}